

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
jmespath_expression::evaluate
          (jmespath_expression *this,reference doc,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *params)

{
  error_code ec_00;
  bool bVar1;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_RSI;
  error_code *in_RDI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar3;
  error_code *in_stack_00000030;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_stack_00000038;
  reference in_stack_00000040;
  error_code ec;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *result;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  error_code *this_00;
  jmespath_error *in_stack_ffffffffffffffb0;
  error_code local_30 [3];
  
  this_00 = in_RDI;
  bVar1 = std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::empty(in_RSI);
  if (bVar1) {
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this_00,
               in_stack_ffffffffffffff88);
    uVar2 = extraout_RDX;
  }
  else {
    std::error_code::error_code(this_00);
    evaluate((jmespath_expression *)ec._0_8_,in_stack_00000040,in_stack_00000038,in_stack_00000030);
    bVar1 = std::error_code::operator_cast_to_bool(local_30);
    uVar2 = extraout_RDX_00;
    if (bVar1) {
      uVar2 = __cxa_allocate_exception(0x58);
      ec_00._M_cat = local_30[0]._M_cat;
      ec_00._M_value = local_30[0]._M_value;
      ec_00._4_4_ = local_30[0]._4_4_;
      jmespath_error::jmespath_error(in_stack_ffffffffffffffb0,ec_00);
      __cxa_throw(uVar2,&jmespath_error::typeinfo,jmespath_error::~jmespath_error);
    }
  }
  bVar3.field_0.int64_.val_ = uVar2;
  bVar3.field_0._0_8_ = in_RDI;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar3.field_0;
}

Assistant:

Json evaluate(reference doc, 
                const std::map<string_type,Json>& params) const
            {
                if (output_stack_.empty())
                {
                    return Json::null();
                }
                std::error_code ec;
                Json result = evaluate(doc, params, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    JSONCONS_THROW(jmespath_error(ec));
                }
                return result;
            }